

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lrit.cc
# Opt level: O0

AncillaryTextHeader * lrit::getHeader<lrit::AncillaryTextHeader>(Buffer *b,int pos)

{
  size_t in_RCX;
  HeaderReader<lrit::AncillaryTextHeader> *in_RDI;
  HeaderReader<lrit::AncillaryTextHeader> r;
  AncillaryTextHeader *h;
  Buffer *in_stack_ffffffffffffff78;
  HeaderReader<lrit::AncillaryTextHeader> *this;
  HeaderReader<lrit::AncillaryTextHeader> local_50;
  
  this = in_RDI;
  HeaderReader<lrit::AncillaryTextHeader>::HeaderReader(in_RDI,in_stack_ffffffffffffff78,0);
  HeaderReader<lrit::AncillaryTextHeader>::getHeader(this);
  HeaderReader<lrit::AncillaryTextHeader>::read
            (&local_50,(int)this + 8,(void *)(long)(int)(*(ushort *)((long)&this->b_ + 2) - 3),
             in_RCX);
  HeaderReader<lrit::AncillaryTextHeader>::~HeaderReader
            ((HeaderReader<lrit::AncillaryTextHeader> *)0x117811);
  return (AncillaryTextHeader *)in_RDI;
}

Assistant:

AncillaryTextHeader getHeader(const Buffer& b, int pos) {
  auto r = HeaderReader<AncillaryTextHeader>(b, pos);
  auto h = r.getHeader();
  r.read(h.text, h.headerLength - 3);
  return h;
}